

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmenc.cc
# Opt level: O1

int write_webm_file_footer(WebmOutputContext *webm_ctx)

{
  long *plVar1;
  Segment *this;
  bool bVar2;
  
  plVar1 = (long *)webm_ctx->writer;
  if ((plVar1 == (long *)0x0) || (this = (Segment *)webm_ctx->segment, this == (Segment *)0x0)) {
    write_webm_file_footer_cold_2();
  }
  else {
    bVar2 = mkvmuxer::Segment::Finalize(this);
    mkvmuxer::Segment::~Segment(this);
    operator_delete(this);
    (**(code **)(*plVar1 + 0x30))(plVar1);
    webm_ctx->writer = (void *)0x0;
    webm_ctx->segment = (void *)0x0;
    if (bVar2) {
      return 0;
    }
    write_webm_file_footer_cold_1();
  }
  return -1;
}

Assistant:

int write_webm_file_footer(struct WebmOutputContext *webm_ctx) {
  if (!webm_ctx->writer || !webm_ctx->segment) {
    fprintf(stderr, "webmenc> segment or writer NULL.\n");
    return -1;
  }
  mkvmuxer::MkvWriter *const writer =
      reinterpret_cast<mkvmuxer::MkvWriter *>(webm_ctx->writer);
  mkvmuxer::Segment *const segment =
      reinterpret_cast<mkvmuxer::Segment *>(webm_ctx->segment);
  const bool ok = segment->Finalize();
  delete segment;
  delete writer;
  webm_ctx->writer = NULL;
  webm_ctx->segment = NULL;

  if (!ok) {
    fprintf(stderr, "webmenc> Segment::Finalize failed.\n");
    return -1;
  }

  return 0;
}